

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntlm.c
# Opt level: O3

CURLcode Curl_auth_create_ntlm_type3_message
                   (Curl_easy *data,char *userp,char *passwdp,ntlmdata *ntlm,bufref *out)

{
  uint uVar1;
  ntlmdata *pnVar2;
  CURLcode CVar3;
  char *pcVar4;
  sbyte sVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  char *__s;
  uint ntresplen;
  size_t local_948;
  char *local_940;
  ulong local_938;
  Curl_easy *local_930;
  uchar *ntlmv2resp;
  ntlmdata *local_920;
  uchar *local_918;
  uchar entropy [8];
  uchar lmresp [24];
  uchar lmbuffer [24];
  uchar ntresp [24];
  uchar ntlmbuf [1024];
  char host [1025];
  
  ntresplen = 0x18;
  ntlmv2resp = (uchar *)0x0;
  local_938 = (ulong)ntlm->flags;
  local_930 = data;
  memset(host,0,0x401);
  lmresp[0] = '\0';
  lmresp[1] = '\0';
  lmresp[2] = '\0';
  lmresp[3] = '\0';
  lmresp[4] = '\0';
  lmresp[5] = '\0';
  lmresp[6] = '\0';
  lmresp[7] = '\0';
  lmresp[8] = '\0';
  lmresp[9] = '\0';
  lmresp[10] = '\0';
  lmresp[0xb] = '\0';
  lmresp[0xc] = '\0';
  lmresp[0xd] = '\0';
  lmresp[0xe] = '\0';
  lmresp[0xf] = '\0';
  lmresp[0x10] = '\0';
  lmresp[0x11] = '\0';
  lmresp[0x12] = '\0';
  lmresp[0x13] = '\0';
  lmresp[0x14] = '\0';
  lmresp[0x15] = '\0';
  lmresp[0x16] = '\0';
  lmresp[0x17] = '\0';
  ntresp[0] = '\0';
  ntresp[1] = '\0';
  ntresp[2] = '\0';
  ntresp[3] = '\0';
  ntresp[4] = '\0';
  ntresp[5] = '\0';
  ntresp[6] = '\0';
  ntresp[7] = '\0';
  ntresp[8] = '\0';
  ntresp[9] = '\0';
  ntresp[10] = '\0';
  ntresp[0xb] = '\0';
  ntresp[0xc] = '\0';
  ntresp[0xd] = '\0';
  ntresp[0xe] = '\0';
  ntresp[0xf] = '\0';
  ntresp[0x10] = '\0';
  ntresp[0x11] = '\0';
  ntresp[0x12] = '\0';
  ntresp[0x13] = '\0';
  ntresp[0x14] = '\0';
  ntresp[0x15] = '\0';
  ntresp[0x16] = '\0';
  ntresp[0x17] = '\0';
  pcVar4 = strchr(userp,0x5c);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = strchr(userp,0x2f);
  }
  uVar19 = (long)pcVar4 - (long)userp;
  __s = pcVar4 + 1;
  if (pcVar4 == (char *)0x0) {
    __s = userp;
  }
  local_940 = userp;
  if (pcVar4 == (char *)0x0) {
    uVar19 = 0;
    local_940 = "";
  }
  local_948 = strlen(__s);
  curl_msnprintf(host,0x401,"%s","WORKSTATION");
  if ((ntlm->flags & 0x80000) == 0) {
    CVar3 = Curl_ntlm_core_mk_nt_hash(passwdp,ntlmbuf);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    Curl_ntlm_core_lm_resp(ntlmbuf,ntlm->nonce,ntresp);
    CVar3 = Curl_ntlm_core_mk_lm_hash(passwdp,lmbuffer);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    local_918 = ntresp;
    Curl_ntlm_core_lm_resp(lmbuffer,ntlm->nonce,lmresp);
    uVar15 = ntlm->flags & 0xfff7ffff;
    ntlm->flags = uVar15;
    sVar9 = local_948;
    uVar13 = 0x18;
  }
  else {
    CVar3 = Curl_rand(local_930,entropy,8);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_nt_hash(passwdp,ntlmbuf);
    sVar9 = local_948;
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_ntlmv2_hash(__s,local_948,local_940,uVar19,ntlmbuf,lmbuffer);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_lmv2_resp(lmbuffer,entropy,ntlm->nonce,lmresp);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    CVar3 = Curl_ntlm_core_mk_ntlmv2_resp(lmbuffer,entropy,ntlm,&ntlmv2resp,&ntresplen);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
    local_918 = ntlmv2resp;
    uVar15 = ntlm->flags;
    uVar13 = ntresplen;
  }
  uVar18 = local_938 & 1;
  uVar6 = (uint)local_938 & 1;
  local_938 = (ulong)uVar6;
  lVar17 = 0x16;
  if (uVar18 == 0) {
    lVar17 = 0xb;
  }
  sVar5 = (sbyte)uVar6;
  lVar10 = sVar9 << sVar5;
  lVar7 = uVar19 << sVar5;
  uVar6 = (uint)lVar7;
  uVar14 = uVar6 + uVar13 + 0x58;
  uVar1 = (uint)lVar10;
  uVar16 = (ulong)(uVar13 >> 8 & 0xff);
  uVar18 = (ulong)(uVar6 >> 8 & 0xff);
  uVar11 = (ulong)(uVar1 >> 8 & 0xff);
  local_920 = ntlm;
  uVar15 = curl_msnprintf((char *)ntlmbuf,0x400,
                          "NTLMSSP%c\x03%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c%c"
                          ,0,0,0,0,0x18,0,0x18,0,0x40,0,0,0,(ulong)(uVar13 & 0xff),uVar16,
                          (ulong)(uVar13 & 0xff),uVar16,0x58,0,0,0,(ulong)(uVar6 & 0xff),uVar18,
                          (ulong)(uVar6 & 0xff),uVar18,(ulong)(uVar13 + 0x58 & 0xff),
                          (ulong)(uVar13 + 0x58 >> 8 & 0xff),0,0,(ulong)(uVar1 & 0xff),uVar11,
                          (ulong)(uVar1 & 0xff),uVar11,(ulong)(uVar14 & 0xff),
                          (ulong)(uVar14 >> 8 & 0xff),0,0,lVar17,0,lVar17,0,
                          (ulong)(uVar14 + uVar1 & 0xff),(ulong)(uVar14 + uVar1 >> 8 & 0xff),0,0,0,0
                          ,0,0,0,0,0,0,(ulong)(uVar15 & 0xff),(ulong)(uVar15 >> 8 & 0xff),
                          (ulong)(uVar15 >> 0x10 & 0xff),(ulong)(uVar15 >> 0x18));
  lVar12 = (long)(int)uVar15;
  if (uVar15 < 1000) {
    *(undefined8 *)(ntlmbuf + lVar12 + 0x10) = lmresp._16_8_;
    *(undefined8 *)(ntlmbuf + lVar12) = lmresp._0_8_;
    *(undefined8 *)(ntlmbuf + lVar12 + 8) = lmresp._8_8_;
    lVar12 = lVar12 + 0x18;
  }
  uVar11 = (ulong)ntresplen;
  uVar18 = lVar12 + uVar11;
  if (uVar18 < 0x401) {
    memcpy(ntlmbuf + lVar12,local_918,uVar11);
    (*Curl_cfree)(ntlmv2resp);
    uVar16 = lVar7 + uVar18;
    if (lVar10 + lVar17 + uVar16 < 0x400) {
      if ((int)local_938 == 0) {
        memcpy(ntlmbuf + uVar18,local_940,uVar19);
        sVar9 = local_948;
        memcpy(ntlmbuf + uVar18 + uVar19,__s,local_948);
        uVar18 = uVar18 + uVar19 + sVar9;
        *(ulong *)(ntlmbuf + uVar18) = CONCAT17(host[7],host._0_7_);
        *(undefined4 *)(ntlmbuf + uVar18 + 7) = host._7_4_;
      }
      else {
        if ((uVar19 & 0x7fffffffffffffff) != 0) {
          uVar8 = 0;
          do {
            ntlmbuf[uVar8 * 2 + lVar12 + uVar11] = local_940[uVar8];
            ntlmbuf[uVar8 * 2 + lVar12 + uVar11 + 1] = '\0';
            uVar8 = uVar8 + 1;
            uVar18 = uVar16;
          } while ((uVar19 & 0x7fffffffffffffff) != uVar8);
        }
        if ((local_948 & 0x7fffffffffffffff) != 0) {
          uVar19 = 0;
          do {
            ntlmbuf[uVar19 * 2 + uVar18] = __s[uVar19];
            ntlmbuf[uVar19 * 2 + uVar18 + 1] = '\0';
            uVar19 = uVar19 + 1;
          } while ((local_948 & 0x7fffffffffffffff) != uVar19);
          uVar18 = uVar18 + lVar10;
        }
        lVar7 = 0;
        do {
          ntlmbuf[lVar7 * 2 + uVar18] = host[lVar7];
          ntlmbuf[lVar7 * 2 + uVar18 + 1] = '\0';
          lVar7 = lVar7 + 1;
        } while (lVar7 != 0xb);
      }
      CVar3 = Curl_bufref_memdup(out,ntlmbuf,uVar18 + lVar17);
      pnVar2 = local_920;
      (*Curl_cfree)(local_920->target_info);
      pnVar2->target_info = (void *)0x0;
      pnVar2->target_info_len = 0;
      return CVar3;
    }
    pcVar4 = "user + domain + host name too big";
  }
  else {
    pcVar4 = "incoming NTLM message too big";
  }
  Curl_failf(local_930,pcVar4);
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

CURLcode Curl_auth_create_ntlm_type3_message(struct Curl_easy *data,
                                             const char *userp,
                                             const char *passwdp,
                                             struct ntlmdata *ntlm,
                                             struct bufref *out)
{
  /* NTLM type-3 message structure:

          Index  Description            Content
            0    NTLMSSP Signature      Null-terminated ASCII "NTLMSSP"
                                        (0x4e544c4d53535000)
            8    NTLM Message Type      long (0x03000000)
           12    LM/LMv2 Response       security buffer
           20    NTLM/NTLMv2 Response   security buffer
           28    Target Name            security buffer
           36    User Name              security buffer
           44    Workstation Name       security buffer
          (52)   Session Key            security buffer (*)
          (60)   Flags                  long (*)
          (64)   OS Version Structure   8 bytes (*)
  52 (64) (72)   Start of data block
                                          (*) -> Optional
  */

  CURLcode result = CURLE_OK;
  size_t size;
  unsigned char ntlmbuf[NTLM_BUFSIZE];
  int lmrespoff;
  unsigned char lmresp[24]; /* fixed-size */
  int ntrespoff;
  unsigned int ntresplen = 24;
  unsigned char ntresp[24]; /* fixed-size */
  unsigned char *ptr_ntresp = &ntresp[0];
  unsigned char *ntlmv2resp = NULL;
  bool unicode = (ntlm->flags & NTLMFLAG_NEGOTIATE_UNICODE) ? TRUE : FALSE;
  char host[HOSTNAME_MAX + 1] = "";
  const char *user;
  const char *domain = "";
  size_t hostoff = 0;
  size_t useroff = 0;
  size_t domoff = 0;
  size_t hostlen = 0;
  size_t userlen = 0;
  size_t domlen = 0;

  memset(lmresp, 0, sizeof(lmresp));
  memset(ntresp, 0, sizeof(ntresp));
  user = strchr(userp, '\\');
  if(!user)
    user = strchr(userp, '/');

  if(user) {
    domain = userp;
    domlen = (user - domain);
    user++;
  }
  else
    user = userp;

  userlen = strlen(user);

#ifndef NTLM_HOSTNAME
  /* Get the machine's un-qualified host name as NTLM doesn't like the fully
     qualified domain name */
  if(Curl_gethostname(host, sizeof(host))) {
    infof(data, "gethostname() failed, continuing without");
    hostlen = 0;
  }
  else {
    hostlen = strlen(host);
  }
#else
  (void)msnprintf(host, sizeof(host), "%s", NTLM_HOSTNAME);
  hostlen = sizeof(NTLM_HOSTNAME)-1;
#endif

  if(ntlm->flags & NTLMFLAG_NEGOTIATE_NTLM2_KEY) {
    unsigned char ntbuffer[0x18];
    unsigned char entropy[8];
    unsigned char ntlmv2hash[0x18];

    /* Full NTLM version 2
       Although this cannot be negotiated, it is used here if available, as
       servers featuring extended security are likely supporting also
       NTLMv2. */
    result = Curl_rand(data, entropy, 8);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    result = Curl_ntlm_core_mk_ntlmv2_hash(user, userlen, domain, domlen,
                                           ntbuffer, ntlmv2hash);
    if(result)
      return result;

    /* LMv2 response */
    result = Curl_ntlm_core_mk_lmv2_resp(ntlmv2hash, entropy,
                                         &ntlm->nonce[0], lmresp);
    if(result)
      return result;

    /* NTLMv2 response */
    result = Curl_ntlm_core_mk_ntlmv2_resp(ntlmv2hash, entropy,
                                           ntlm, &ntlmv2resp, &ntresplen);
    if(result)
      return result;

    ptr_ntresp = ntlmv2resp;
  }
  else {

    unsigned char ntbuffer[0x18];
    unsigned char lmbuffer[0x18];

    /* NTLM version 1 */

    result = Curl_ntlm_core_mk_nt_hash(passwdp, ntbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], ntresp);

    result = Curl_ntlm_core_mk_lm_hash(passwdp, lmbuffer);
    if(result)
      return result;

    Curl_ntlm_core_lm_resp(lmbuffer, &ntlm->nonce[0], lmresp);
    ntlm->flags &= ~NTLMFLAG_NEGOTIATE_NTLM2_KEY;

    /* A safer but less compatible alternative is:
     *   Curl_ntlm_core_lm_resp(ntbuffer, &ntlm->nonce[0], lmresp);
     * See https://davenport.sourceforge.net/ntlm.html#ntlmVersion2 */
  }

  if(unicode) {
    domlen = domlen * 2;
    userlen = userlen * 2;
    hostlen = hostlen * 2;
  }

  lmrespoff = 64; /* size of the message header */
  ntrespoff = lmrespoff + 0x18;
  domoff = ntrespoff + ntresplen;
  useroff = domoff + domlen;
  hostoff = useroff + userlen;

  /* Create the big type-3 message binary blob */
  size = msnprintf((char *)ntlmbuf, NTLM_BUFSIZE,
                   NTLMSSP_SIGNATURE "%c"
                   "\x03%c%c%c"  /* 32-bit type = 3 */

                   "%c%c"  /* LanManager length */
                   "%c%c"  /* LanManager allocated space */
                   "%c%c"  /* LanManager offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* NT-response length */
                   "%c%c"  /* NT-response allocated space */
                   "%c%c"  /* NT-response offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* domain length */
                   "%c%c"  /* domain allocated space */
                   "%c%c"  /* domain name offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* user length */
                   "%c%c"  /* user allocated space */
                   "%c%c"  /* user offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* host length */
                   "%c%c"  /* host allocated space */
                   "%c%c"  /* host offset */
                   "%c%c"  /* 2 zeroes */

                   "%c%c"  /* session key length (unknown purpose) */
                   "%c%c"  /* session key allocated space (unknown purpose) */
                   "%c%c"  /* session key offset (unknown purpose) */
                   "%c%c"  /* 2 zeroes */

                   "%c%c%c%c",  /* flags */

                   /* domain string */
                   /* user string */
                   /* host string */
                   /* LanManager response */
                   /* NT response */

                   0,                /* null-termination */
                   0, 0, 0,          /* type-3 long, the 24 upper bits */

                   SHORTPAIR(0x18),  /* LanManager response length, twice */
                   SHORTPAIR(0x18),
                   SHORTPAIR(lmrespoff),
                   0x0, 0x0,

                   SHORTPAIR(ntresplen),  /* NT-response length, twice */
                   SHORTPAIR(ntresplen),
                   SHORTPAIR(ntrespoff),
                   0x0, 0x0,

                   SHORTPAIR(domlen),
                   SHORTPAIR(domlen),
                   SHORTPAIR(domoff),
                   0x0, 0x0,

                   SHORTPAIR(userlen),
                   SHORTPAIR(userlen),
                   SHORTPAIR(useroff),
                   0x0, 0x0,

                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostlen),
                   SHORTPAIR(hostoff),
                   0x0, 0x0,

                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,
                   0x0, 0x0,

                   LONGQUARTET(ntlm->flags));

  DEBUGASSERT(size == 64);
  DEBUGASSERT(size == (size_t)lmrespoff);

  /* We append the binary hashes */
  if(size < (NTLM_BUFSIZE - 0x18)) {
    memcpy(&ntlmbuf[size], lmresp, 0x18);
    size += 0x18;
  }

  DEBUG_OUT({
    fprintf(stderr, "**** TYPE3 header lmresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[lmrespoff], 0x18);
  });

  /* ntresplen + size should not be risking an integer overflow here */
  if(ntresplen + size > sizeof(ntlmbuf)) {
    failf(data, "incoming NTLM message too big");
    return CURLE_OUT_OF_MEMORY;
  }
  DEBUGASSERT(size == (size_t)ntrespoff);
  memcpy(&ntlmbuf[size], ptr_ntresp, ntresplen);
  size += ntresplen;

  DEBUG_OUT({
    fprintf(stderr, "\n   ntresp=");
    ntlm_print_hex(stderr, (char *)&ntlmbuf[ntrespoff], ntresplen);
  });

  free(ntlmv2resp);/* Free the dynamic buffer allocated for NTLMv2 */

  DEBUG_OUT({
    fprintf(stderr, "\n   flags=0x%02.2x%02.2x%02.2x%02.2x 0x%08.8x ",
            LONGQUARTET(ntlm->flags), ntlm->flags);
    ntlm_print_flags(stderr, ntlm->flags);
    fprintf(stderr, "\n****\n");
  });

  /* Make sure that the domain, user and host strings fit in the
     buffer before we copy them there. */
  if(size + userlen + domlen + hostlen >= NTLM_BUFSIZE) {
    failf(data, "user + domain + host name too big");
    return CURLE_OUT_OF_MEMORY;
  }

  DEBUGASSERT(size == domoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], domain, domlen / 2);
  else
    memcpy(&ntlmbuf[size], domain, domlen);

  size += domlen;

  DEBUGASSERT(size == useroff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], user, userlen / 2);
  else
    memcpy(&ntlmbuf[size], user, userlen);

  size += userlen;

  DEBUGASSERT(size == hostoff);
  if(unicode)
    unicodecpy(&ntlmbuf[size], host, hostlen / 2);
  else
    memcpy(&ntlmbuf[size], host, hostlen);

  size += hostlen;

  /* Return the binary blob. */
  result = Curl_bufref_memdup(out, ntlmbuf, size);

  Curl_auth_cleanup_ntlm(ntlm);

  return result;
}